

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::incoming_connection(session_impl *this,socket_type *s)

{
  _Atomic_word *p_Var1;
  int *piVar2;
  mutex *pmVar3;
  counters *this_00;
  session_settings *this_01;
  peer_class_t c;
  ulong uVar4;
  pointer psVar5;
  pointer psVar6;
  ip_filter *this_02;
  bool bVar7;
  socket_type_t sVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int64_t iVar13;
  peer_class *ppVar14;
  size_t sVar15;
  int __type;
  error_code *ec_00;
  error_code *ec_01;
  error_code *ec_02;
  char *pcVar16;
  long lVar17;
  socket_type_t local_2ea;
  operation_t local_2e9;
  endpoint local;
  close_reason_t local_2c6;
  endpoint endp;
  error_code ec;
  peer_class_set pcs;
  error_code local_238;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  io_context *local_208;
  element_type *local_200;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_1f8;
  _Move_ctor_base<false,_libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
  local_1f0;
  torrent_peer *local_58;
  peer_id local_50;
  
  if (this->m_abort == true) {
    pcVar16 = " <== INCOMING CONNECTION [ ignored, aborting ]";
LAB_002c1246:
    session_log(this,pcVar16);
    return;
  }
  if (this->m_paused == true) {
    pcVar16 = " <== INCOMING CONNECTION [ ignored, paused ]";
    goto LAB_002c1246;
  }
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_228._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&ec;
  ::std::
  visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___tream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>const&>
            (&endp,(anon_class_8_1_3fcf655c *)local_228,
             &s->
              super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
            );
  if (ec.failed_ == true) {
    if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) == 0) {
      return;
    }
    print_error_abi_cxx11_((string *)local_228,(libtorrent *)&ec,ec_00);
    pcVar16 = " <== INCOMING CONNECTION [ rejected, could not retrieve remote endpoint: %s ]";
    goto LAB_002c12d2;
  }
  pmVar3 = &(this->m_settings).m_mutex;
  local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
  local_228._0_8_ = pmVar3;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_228);
  local_228[8] = 1;
  uVar4 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[0];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_228);
  if (((uVar4 >> 0x21 & 1) == 0) && (bVar7 = is_utp(s), bVar7)) {
    session_log(this,"<== INCOMING CONNECTION [ rejected uTP connection ]");
    if (((this->m_alerts).m_alert_mask._M_i.m_val >> 8 & 1) == 0) {
      return;
    }
    local_228._0_8_ = (error_code *)0x0;
    local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pcs.m_size = '\x04';
    pcs._1_3_ = 0;
    alert_manager::
    emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
              (&this->m_alerts,(torrent_handle *)local_228,&endp,(reason_t *)&pcs);
LAB_002c1bd0:
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)(local_228._8_8_ + 0xc);
        iVar10 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar10 = *(_Atomic_word *)(local_228._8_8_ + 0xc);
        *(int *)(local_228._8_8_ + 0xc) = iVar10 + -1;
      }
      if (iVar10 == 1) {
        (**(code **)(*(long *)local_228._8_8_ + 0x18))();
      }
    }
    return;
  }
  local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
  local_228._0_8_ = pmVar3;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_228);
  local_228[8] = '\x01';
  uVar4 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[0];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_228);
  if (((uVar4 >> 0x23 & 1) == 0) &&
     (*(__index_type *)
       ((long)&(s->
               super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
               ).
               super__Variant_base<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
               .
               super__Move_assign_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
               .
               super__Copy_assign_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
               .
               super__Move_ctor_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
               .
               super__Copy_ctor_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
               .
               super__Variant_storage_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
       + 0x170) == '\0')) {
    session_log(this,"<== INCOMING CONNECTION [ rejected TCP connection ]");
    if (((this->m_alerts).m_alert_mask._M_i.m_val >> 8 & 1) == 0) {
      return;
    }
    local_228._0_8_ = (error_code *)0x0;
    local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pcs.m_size = '\x05';
    pcs._1_3_ = 0;
    alert_manager::
    emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
              (&this->m_alerts,(torrent_handle *)local_228,&endp,(reason_t *)&pcs);
    goto LAB_002c1bd0;
  }
  if ((this->m_outgoing_interfaces).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_outgoing_interfaces).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_228._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&ec;
    ::std::
    visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___tream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>const&>
              (&local,(anon_class_8_1_3fcf655c *)local_228,
               &s->
                super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              );
    if (ec.failed_ == true) {
      if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) == 0) {
        return;
      }
      print_error_abi_cxx11_((string *)local_228,(libtorrent *)&ec,ec_01);
      pcVar16 = "<== INCOMING CONNECTION [ rejected connection: %s ]";
LAB_002c12d2:
      session_log(this,pcVar16,local_228._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._0_8_ == &local_218) {
        return;
      }
      operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
      return;
    }
    if (local.impl_.data_.base.sa_family != 2) {
      local_228[8] = local.impl_.data_._8_1_;
      local_228[9] = local.impl_.data_._9_1_;
      local_228[10] = local.impl_.data_._10_1_;
      local_228[0xb] = local.impl_.data_._11_1_;
      local_228[0xc] = local.impl_.data_._12_1_;
      local_228[0xd] = local.impl_.data_._13_1_;
      local_228[0xe] = local.impl_.data_._14_1_;
      local_228[0xf] = local.impl_.data_._15_1_;
      local_218._M_allocated_capacity = local.impl_.data_._16_8_;
      local_218._8_8_ = ZEXT48(local.impl_.data_.v6.sin6_scope_id);
      local_228._4_4_ = 0;
    }
    else {
      local_228[8] = '\0';
      local_228[9] = '\0';
      local_228[10] = '\0';
      local_228[0xb] = '\0';
      local_228[0xc] = '\0';
      local_228[0xd] = '\0';
      local_228[0xe] = '\0';
      local_228[0xf] = '\0';
      local_218._M_allocated_capacity = 0;
      local_218._8_8_ = 0;
      local_228._4_4_ = local.impl_.data_.v6.sin6_flowinfo;
    }
    local_228._1_3_ = 0;
    local_228[0] = local.impl_.data_.base.sa_family != 2;
    bVar7 = verify_incoming_interface(this,(address *)local_228);
    if (!bVar7) {
      if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
        if (local.impl_.data_.base.sa_family != 2) {
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems._4_8_ = local.impl_.data_.v4.sin_zero;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[3].m_val = local.impl_.data_._16_4_;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[4].m_val = local.impl_.data_._20_4_;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems._20_8_ = ZEXT48(local.impl_.data_.v6.sin6_scope_id);
          local.impl_.data_.v6.sin6_flowinfo = 0;
        }
        else {
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[1].m_val = 0;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[2].m_val = 0;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[3].m_val = 0;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[4].m_val = 0;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[5].m_val = 0;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[6].m_val = 0;
        }
        pcs._0_4_ = ZEXT14(local.impl_.data_.base.sa_family != 2);
        pcs.m_class.
        super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
        ._M_elems[0].m_val = (uint)local.impl_.data_.v4.sin_addr.s_addr;
        boost::asio::ip::address::to_string_abi_cxx11_((string *)local_228,(address *)&pcs);
        session_log(this,
                    "<== INCOMING CONNECTION [ rejected, local interface has incoming connections disabled: %s ]"
                    ,local_228._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._0_8_ != &local_218) {
          operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
        }
      }
      if (((this->m_alerts).m_alert_mask._M_i.m_val >> 8 & 1) == 0) {
        return;
      }
      local_228._0_8_ = (error_code *)0x0;
      local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pcs.m_size = '\x06';
      pcs._1_3_ = 0;
      alert_manager::
      emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
                (&this->m_alerts,(torrent_handle *)local_228,&endp,(reason_t *)&pcs);
      goto LAB_002c1bd0;
    }
    if (local.impl_.data_.base.sa_family != 2) {
      local_228[8] = local.impl_.data_._8_1_;
      local_228[9] = local.impl_.data_._9_1_;
      local_228[10] = local.impl_.data_._10_1_;
      local_228[0xb] = local.impl_.data_._11_1_;
      local_228[0xc] = local.impl_.data_._12_1_;
      local_228[0xd] = local.impl_.data_._13_1_;
      local_228[0xe] = local.impl_.data_._14_1_;
      local_228[0xf] = local.impl_.data_._15_1_;
      local_218._M_allocated_capacity = local.impl_.data_._16_8_;
      local_218._8_8_ = ZEXT48(local.impl_.data_.v6.sin6_scope_id);
      local_228._4_4_ = 0;
    }
    else {
      local_228[8] = '\0';
      local_228[9] = '\0';
      local_228[10] = '\0';
      local_228[0xb] = '\0';
      local_228[0xc] = '\0';
      local_228[0xd] = '\0';
      local_228[0xe] = '\0';
      local_228[0xf] = '\0';
      local_218._M_allocated_capacity = 0;
      local_218._8_8_ = 0;
      local_228._4_4_ = local.impl_.data_.v6.sin6_flowinfo;
    }
    local_228._1_3_ = 0;
    local_228[0] = local.impl_.data_.base.sa_family != 2;
    is_utp(s);
    bVar7 = verify_bound_address(this,(address *)local_228,false,&ec);
    if (!bVar7) {
      uVar11 = (this->m_alerts).m_alert_mask._M_i.m_val;
      if (ec.failed_ == true) {
        if ((uVar11 >> 0xd & 1) == 0) {
          return;
        }
        print_error_abi_cxx11_((string *)local_228,(libtorrent *)&ec,ec_02);
        pcVar16 = "<== INCOMING CONNECTION [ rejected, not allowed local interface: %s ]";
        goto LAB_002c12d2;
      }
      if ((uVar11 >> 0xd & 1) != 0) {
        if (local.impl_.data_.base.sa_family != 2) {
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems._4_8_ = local.impl_.data_.v4.sin_zero;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[3].m_val = local.impl_.data_._16_4_;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[4].m_val = local.impl_.data_._20_4_;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems._20_8_ = ZEXT48(local.impl_.data_.v6.sin6_scope_id);
          local.impl_.data_.v6.sin6_flowinfo = 0;
        }
        else {
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[1].m_val = 0;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[2].m_val = 0;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[3].m_val = 0;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[4].m_val = 0;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[5].m_val = 0;
          pcs.m_class.
          super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
          ._M_elems[6].m_val = 0;
        }
        pcs._0_4_ = ZEXT14(local.impl_.data_.base.sa_family != 2);
        pcs.m_class.
        super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
        ._M_elems[0].m_val = (uint)local.impl_.data_.v4.sin_addr.s_addr;
        boost::asio::ip::address::to_string_abi_cxx11_((string *)local_228,(address *)&pcs);
        session_log(this,"<== INCOMING CONNECTION [ rejected, not allowed local interface: %s ]",
                    local_228._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._0_8_ != &local_218) {
          operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
        }
      }
      if (((this->m_alerts).m_alert_mask._M_i.m_val >> 8 & 1) == 0) {
        return;
      }
      local_228._0_8_ = (error_code *)0x0;
      local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pcs.m_size = '\x06';
      pcs._1_3_ = 0;
      alert_manager::
      emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
                (&this->m_alerts,(torrent_handle *)local_228,&endp,(reason_t *)&pcs);
      goto LAB_002c1bd0;
    }
  }
  if (endp.impl_.data_.base.sa_family != 2) {
    local_228._8_8_ = CONCAT44(endp.impl_.data_._12_4_,endp.impl_.data_._8_4_);
    local_218._M_allocated_capacity = CONCAT44(endp.impl_.data_._20_4_,endp.impl_.data_._16_4_);
    local_218._8_8_ = ZEXT48(endp.impl_.data_.v6.sin6_scope_id);
    local_228._4_4_ = 0;
  }
  else {
    local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_218._M_allocated_capacity = 0;
    local_218._8_8_ = 0;
    local_228._4_4_ = endp.impl_.data_.v4.sin_addr.s_addr;
  }
  local_228._1_3_ = 0;
  local_228[0] = endp.impl_.data_.base.sa_family != 2;
  bVar7 = is_local((address *)local_228);
  if (!bVar7) {
    counters::set_value(&this->m_stats_counters,0x116,1);
  }
  this_00 = &this->m_stats_counters;
  iVar13 = counters::operator[](this_00,0xdb);
  if ((iVar13 == 0) &&
     (this_02 = (this->m_ip_filter).
                super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     this_02 != (ip_filter *)0x0)) {
    if (endp.impl_.data_.base.sa_family != 2) {
      local_228._8_8_ = CONCAT44(endp.impl_.data_._12_4_,endp.impl_.data_._8_4_);
      local_218._M_allocated_capacity = CONCAT44(endp.impl_.data_._20_4_,endp.impl_.data_._16_4_);
      local_218._8_8_ = ZEXT48(endp.impl_.data_.v6.sin6_scope_id);
      local_228._4_4_ = 0;
    }
    else {
      local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_218._M_allocated_capacity = 0;
      local_218._8_8_ = 0;
      local_228._4_4_ = endp.impl_.data_.v4.sin_addr.s_addr;
    }
    local_228._1_3_ = 0;
    local_228[0] = endp.impl_.data_.base.sa_family != 2;
    uVar11 = ip_filter::access(this_02,local_228,__type);
    if ((uVar11 & 1) != 0) {
      session_log(this,"<== INCOMING CONNECTION [ filtered blocked ip ]");
      if (((this->m_alerts).m_alert_mask._M_i.m_val >> 8 & 1) == 0) {
        return;
      }
      local_228._0_8_ = (error_code *)0x0;
      local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pcs.m_size = '\0';
      pcs._1_3_ = 0;
      alert_manager::
      emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
                (&this->m_alerts,(torrent_handle *)local_228,&endp,(reason_t *)&pcs);
      goto LAB_002c1bd0;
    }
  }
  psVar5 = (this->m_ses_extensions)._M_elems[4].
           super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (this->m_ses_extensions)._M_elems[4].
           super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((psVar5 == psVar6) &&
     ((this->m_torrents).m_array.
      super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->m_torrents).m_array.
      super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pcVar16 = "<== INCOMING CONNECTION [ rejected, there are no torrents ]";
    goto LAB_002c165f;
  }
  pcs._0_4_ = pcs._0_4_ & 0xffffff00;
  if (endp.impl_.data_.base.sa_family != 2) {
    local_228._8_8_ = CONCAT44(endp.impl_.data_._12_4_,endp.impl_.data_._8_4_);
    local_218._M_allocated_capacity = CONCAT44(endp.impl_.data_._20_4_,endp.impl_.data_._16_4_);
    local_218._8_8_ = ZEXT48(endp.impl_.data_.v6.sin6_scope_id);
    endp.impl_.data_.v6.sin6_flowinfo = 0;
  }
  else {
    local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_218._M_allocated_capacity = 0;
    local_218._8_8_ = 0;
  }
  local_228._1_3_ = 0;
  local_228[0] = endp.impl_.data_.base.sa_family != 2;
  this_01 = &this->m_settings;
  local_228._4_4_ = endp.impl_.data_.v6.sin6_flowinfo;
  sVar8 = socket_type_idx(s);
  set_peer_classes(this,&pcs,(address *)local_228,sVar8);
  if (pcs.m_size < '\x01') {
LAB_002c17a3:
    uVar11 = 100;
  }
  else {
    lVar17 = 0;
    uVar11 = 0;
    do {
      c.m_val = pcs.m_class.
                super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
                ._M_elems[lVar17].m_val;
      ppVar14 = peer_class_pool::at(&this->m_classes,c);
      if (ppVar14 != (peer_class *)0x0) {
        ppVar14 = peer_class_pool::at(&this->m_classes,c);
        if ((int)uVar11 <= ppVar14->connection_limit_factor) {
          uVar11 = ppVar14->connection_limit_factor;
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < pcs.m_size);
    if (uVar11 == 0) goto LAB_002c17a3;
  }
  iVar10 = session_settings::get_int(this_01,0x4055);
  lVar17 = ((long)iVar10 * 100) / (long)(ulong)uVar11;
  sVar15 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  iVar10 = session_settings::get_int(this_01,0x4056);
  if (iVar10 + lVar17 <= (long)(int)sVar15) {
    if (((this->m_alerts).m_alert_mask._M_i.m_val & 0x20) != 0) {
      local.impl_.data_._0_8_ = 0;
      local.impl_.data_._8_1_ = '\0';
      local.impl_.data_._9_1_ = '\0';
      local.impl_.data_._10_1_ = '\0';
      local.impl_.data_._11_1_ = '\0';
      local.impl_.data_._12_1_ = '\0';
      local.impl_.data_._13_1_ = '\0';
      local.impl_.data_._14_1_ = '\0';
      local.impl_.data_._15_1_ = '\0';
      local_228._0_8_ = (error_code *)0x0;
      local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_218._M_allocated_capacity = local_218._M_allocated_capacity & 0xffffffff00000000;
      local_2e9 = bittorrent;
      local_2ea = socket_type_idx(s);
      local_238 = errors::make_error_code(too_many_connections);
      local_2c6 = none;
      alert_manager::
      emplace_alert<libtorrent::peer_disconnected_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::digest32<160l>,libtorrent::operation_t,libtorrent::socket_type_t,boost::system::error_code,libtorrent::close_reason_t>
                (&this->m_alerts,(torrent_handle *)&local,&endp,(digest32<160L> *)local_228,
                 &local_2e9,&local_2ea,&local_238,&local_2c6);
      if (local.impl_.data_.v4.sin_zero != (uchar  [8])0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar2 = (int *)((long)local.impl_.data_.v4.sin_zero + 0xc);
          iVar10 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
        }
        else {
          iVar10 = *(int *)((long)local.impl_.data_.v4.sin_zero + 0xc);
          *(int *)((long)local.impl_.data_.v4.sin_zero + 0xc) = iVar10 + -1;
        }
        if (iVar10 == 1) {
          (**(code **)(*(long *)local.impl_.data_.v4.sin_zero + 0x18))();
        }
      }
    }
    if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) == 0) {
      return;
    }
    sVar15 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    uVar11 = session_settings::get_int(this_01,0x4055);
    uVar12 = session_settings::get_int(this_01,0x4056);
    session_log(this,
                "<== INCOMING CONNECTION [ connections limit exceeded, conns: %d, limit: %d, slack: %d ]"
                ,(ulong)(uint)sVar15,(ulong)uVar11,(ulong)uVar12);
    return;
  }
  bVar7 = session_settings::get_bool(this_01,0x801c);
  if (((psVar5 != psVar6) || (bVar7)) ||
     (bVar7 = ::std::
              any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>*,std::vector<std::shared_ptr<libtorrent::aux::torrent>,std::allocator<std::shared_ptr<libtorrent::aux::torrent>>>>,libtorrent::aux::session_impl::incoming_connection(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::___tream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>)::__0>
                        ((this->m_torrents).m_array.
                         super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->m_torrents).m_array.
                         super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish), bVar7)) {
    counters::inc_stats_counter(this_00,0x38,1);
    if (((this->m_alerts).m_alert_mask._M_i.m_val & 2) != 0) {
      sVar8 = socket_type_idx(s);
      local_228[0] = sVar8;
      alert_manager::
      emplace_alert<libtorrent::incoming_connection_alert,libtorrent::socket_type_t,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&>
                (&this->m_alerts,local_228,&endp);
    }
    local_218._8_8_ =
         (this->m_disk_thread)._M_t.
         super___uniq_ptr_impl<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>
         ._M_t.
         super__Tuple_impl<0UL,_libtorrent::disk_interface_*,_std::default_delete<libtorrent::disk_interface>_>
         .super__Head_base<0UL,_libtorrent::disk_interface_*,_false>._M_head_impl;
    local_208 = this->m_io_context;
    local_200 = (element_type *)0x0;
    _Stack_1f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228._0_8_ = this;
    local_228._8_8_ = this_01;
    local_218._M_allocated_capacity = (size_type)this_00;
    ::std::__detail::__variant::
    _Move_ctor_base<false,_libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
    ::_Move_ctor_base(&local_1f0,
                      (_Move_ctor_base<false,_libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                       *)s);
    local_58 = (torrent_peer *)0x0;
    generate_peer_id(&local_50,this_01);
    ::std::__shared_ptr<libtorrent::aux::bt_peer_connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<libtorrent::aux::bt_peer_connection>,libtorrent::aux::peer_connection_args&>
              ((__shared_ptr<libtorrent::aux::bt_peer_connection,(__gnu_cxx::_Lock_policy)2> *)
               &local_238,(allocator<libtorrent::aux::bt_peer_connection> *)&local_2c6,
               (peer_connection_args *)local_228);
    local.impl_.data_._0_4_ = local_238.val_;
    local.impl_.data_._4_1_ = local_238.failed_;
    local.impl_.data_._5_3_ = local_238._5_3_;
    local.impl_.data_.v4.sin_zero = (uchar  [8])local_238.cat_;
    cVar9 = (**(code **)(*(long *)local_238._0_8_ + 8))(local_238._0_8_);
    if (cVar9 == '\0') {
      sVar15 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (lVar17 <= (int)sVar15) {
        *(byte *)(local_238._0_8_ + 0x887) = *(byte *)(local_238._0_8_ + 0x887) | 0x10;
        sVar15 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      ::std::
      vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
      ::reserve(&this->m_undead_peers,
                sVar15 + ((long)(this->m_undead_peers).
                                super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_undead_peers).
                                super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) + 1);
      ::std::
      _Rb_tree<std::shared_ptr<libtorrent::aux::peer_connection>,std::shared_ptr<libtorrent::aux::peer_connection>,std::_Identity<std::shared_ptr<libtorrent::aux::peer_connection>>,std::less<std::shared_ptr<libtorrent::aux::peer_connection>>,std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>>>
      ::_M_insert_unique<std::shared_ptr<libtorrent::aux::peer_connection>const&>
                ((_Rb_tree<std::shared_ptr<libtorrent::aux::peer_connection>,std::shared_ptr<libtorrent::aux::peer_connection>,std::_Identity<std::shared_ptr<libtorrent::aux::peer_connection>>,std::less<std::shared_ptr<libtorrent::aux::peer_connection>>,std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>>>
                  *)&this->m_connections,(shared_ptr<libtorrent::aux::peer_connection> *)&local);
      (**(code **)(*(long *)local.impl_.data_._0_8_ + 0x28))();
      local_238.cat_ = (error_category *)local.impl_.data_.v4.sin_zero;
    }
    if ((uchar  [8])local_238.cat_ != (uchar  [8])0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.cat_);
    }
    peer_connection_args::~peer_connection_args((peer_connection_args *)local_228);
    return;
  }
  pcVar16 = "<== INCOMING CONNECTION [ rejected, no active torrents ]";
LAB_002c165f:
  session_log(this,pcVar16);
  return;
}

Assistant:

void session_impl::incoming_connection(socket_type s)
	{
		TORRENT_ASSERT(is_single_thread());

		if (m_abort)
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log(" <== INCOMING CONNECTION [ ignored, aborting ]");
#endif
			return;
		}

		if (m_paused)
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log(" <== INCOMING CONNECTION [ ignored, paused ]");
#endif
			return;
		}

		error_code ec;
		// we got a connection request!
		tcp::endpoint endp = s.remote_endpoint(ec);

		if (ec)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				session_log(" <== INCOMING CONNECTION [ rejected, could "
					"not retrieve remote endpoint: %s ]"
					, print_error(ec).c_str());
			}
#endif
			return;
		}

		if (!m_settings.get_bool(settings_pack::enable_incoming_utp)
			&& is_utp(s))
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("<== INCOMING CONNECTION [ rejected uTP connection ]");
#endif
			if (m_alerts.should_post<peer_blocked_alert>())
				m_alerts.emplace_alert<peer_blocked_alert>(torrent_handle()
					, endp, peer_blocked_alert::utp_disabled);
			return;
		}

		if (!m_settings.get_bool(settings_pack::enable_incoming_tcp)
			&& std::get_if<tcp::socket>(&s))
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("<== INCOMING CONNECTION [ rejected TCP connection ]");
#endif
			if (m_alerts.should_post<peer_blocked_alert>())
				m_alerts.emplace_alert<peer_blocked_alert>(torrent_handle()
					, endp, peer_blocked_alert::tcp_disabled);
			return;
		}

		// if there are outgoing interfaces specified, verify this
		// peer is correctly bound to one of them
		if (!m_outgoing_interfaces.empty())
		{
			tcp::endpoint local = s.local_endpoint(ec);
			if (ec)
			{
#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					session_log("<== INCOMING CONNECTION [ rejected connection: %s ]"
						, print_error(ec).c_str());
				}
#endif
				return;
			}

			if (!verify_incoming_interface(local.address()))
			{
#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					session_log("<== INCOMING CONNECTION [ rejected, local interface has incoming connections disabled: %s ]"
						, local.address().to_string().c_str());
				}
#endif
				if (m_alerts.should_post<peer_blocked_alert>())
					m_alerts.emplace_alert<peer_blocked_alert>(torrent_handle()
						, endp, peer_blocked_alert::invalid_local_interface);
				return;
			}
			if (!verify_bound_address(local.address(), is_utp(s), ec))
			{
				if (ec)
				{
#ifndef TORRENT_DISABLE_LOGGING
					if (should_log())
					{
						session_log("<== INCOMING CONNECTION [ rejected, not allowed local interface: %s ]"
							, print_error(ec).c_str());
					}
#endif
					return;
				}

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					session_log("<== INCOMING CONNECTION [ rejected, not allowed local interface: %s ]"
						, local.address().to_string().c_str());
				}
#endif
				if (m_alerts.should_post<peer_blocked_alert>())
					m_alerts.emplace_alert<peer_blocked_alert>(torrent_handle()
						, endp, peer_blocked_alert::invalid_local_interface);
				return;
			}
		}

		// local addresses do not count, since it's likely
		// coming from our own client through local service discovery
		// and it does not reflect whether or not a router is open
		// for incoming connections or not.
		if (!is_local(endp.address()))
			m_stats_counters.set_value(counters::has_incoming_connections, 1);

		// this filter is ignored if a single torrent
		// is set to ignore the filter, since this peer might be
		// for that torrent
		if (m_stats_counters[counters::non_filter_torrents] == 0
			&& m_ip_filter
			&& (m_ip_filter->access(endp.address()) & ip_filter::blocked))
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("<== INCOMING CONNECTION [ filtered blocked ip ]");
#endif
			if (m_alerts.should_post<peer_blocked_alert>())
				m_alerts.emplace_alert<peer_blocked_alert>(torrent_handle()
					, endp, peer_blocked_alert::ip_filter);
			return;
		}

		bool want_on_unknown_torrent = false;
#ifndef TORRENT_DISABLE_EXTENSIONS
		want_on_unknown_torrent = !m_ses_extensions[plugins_unknown_torrent_idx].empty();
#endif

		// check if we have any active torrents
		// or if there is an extension that wants on_unknown_torrent
		// if we don't reject the connection
		if (m_torrents.empty() && !want_on_unknown_torrent)
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("<== INCOMING CONNECTION [ rejected, there are no torrents ]");
#endif
			return;
		}

		// figure out which peer classes this is connections has,
		// to get connection_limit_factor
		peer_class_set pcs;
		set_peer_classes(&pcs, endp.address(), socket_type_idx(s));
		int connection_limit_factor = 0;
		for (int i = 0; i < pcs.num_classes(); ++i)
		{
			peer_class_t pc = pcs.class_at(i);
			if (m_classes.at(pc) == nullptr) continue;
			int f = m_classes.at(pc)->connection_limit_factor;
			if (connection_limit_factor < f) connection_limit_factor = f;
		}
		if (connection_limit_factor == 0) connection_limit_factor = 100;

		std::int64_t limit = m_settings.get_int(settings_pack::connections_limit);
		limit = limit * 100 / connection_limit_factor;

		// don't allow more connections than the max setting
		// weighed by the peer class' setting
		bool reject = num_connections() >= limit + m_settings.get_int(settings_pack::connections_slack);

		if (reject)
		{
			if (m_alerts.should_post<peer_disconnected_alert>())
			{
				m_alerts.emplace_alert<peer_disconnected_alert>(torrent_handle(), endp, peer_id()
						, operation_t::bittorrent, socket_type_idx(s)
						, error_code(errors::too_many_connections)
						, close_reason_t::none);
			}
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				session_log("<== INCOMING CONNECTION [ connections limit exceeded, conns: %d, limit: %d, slack: %d ]"
					, num_connections(), m_settings.get_int(settings_pack::connections_limit)
					, m_settings.get_int(settings_pack::connections_slack));
			}
#endif
			return;
		}

		// if we don't have any active torrents, there's no
		// point in accepting this connection. If, however,
		// the setting to start up queued torrents when they
		// get an incoming connection is enabled or if there is
		// an extension that wants on_unknown_torrent, we cannot
		// perform this check.
		if (!m_settings.get_bool(settings_pack::incoming_starts_queued_torrents) && !want_on_unknown_torrent)
		{
			bool has_active_torrent = std::any_of(m_torrents.begin(), m_torrents.end()
				, [](std::shared_ptr<torrent> const& i)
				{ return !i->is_torrent_paused(); });
			if (!has_active_torrent)
			{
#ifndef TORRENT_DISABLE_LOGGING
				session_log("<== INCOMING CONNECTION [ rejected, no active torrents ]");
#endif
				return;
			}
		}

		m_stats_counters.inc_stats_counter(counters::incoming_connections);

		if (m_alerts.should_post<incoming_connection_alert>())
			m_alerts.emplace_alert<incoming_connection_alert>(socket_type_idx(s), endp);

		peer_connection_args pack{
			this
			, &m_settings
			, &m_stats_counters
			, m_disk_thread.get()
			, &m_io_context
			, std::weak_ptr<torrent>()
			, std::move(s)
			, endp
			, nullptr
			, aux::generate_peer_id(m_settings)
		};

		std::shared_ptr<peer_connection> c
			= std::make_shared<bt_peer_connection>(pack);

		if (!c->is_disconnecting())
		{
			// in case we've exceeded the limit, let this peer know that
			// as soon as it's received the handshake, it needs to either
			// disconnect or pick another peer to disconnect
			if (num_connections() >= limit)
				c->peer_exceeds_limit();

			TORRENT_ASSERT(!c->m_in_constructor);
			// removing a peer may not throw an exception, so prepare for this
			// connection to be added to the undead peers now.
			m_undead_peers.reserve(m_undead_peers.size() + m_connections.size() + 1);
			m_connections.insert(c);
			c->start();
		}
	}